

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  byte bVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  i64 iVar7;
  undefined4 uStack_38;
  int iVal;
  
  iVar5 = *pi;
  if (n <= iVar5) {
LAB_001b922d:
    *piOff = -1;
    return 1;
  }
  iVar7 = *piOff;
  bVar1 = a[iVar5];
  _uStack_38 = (ulong)CONCAT14(bVar1,in_EAX);
  if ((char)bVar1 < '\0') {
    iVar2 = sqlite3Fts5GetVarint32(a + iVar5,(u32 *)&iVal);
    uVar4 = iVal;
  }
  else {
    iVar2 = 1;
    uVar4 = (uint)bVar1;
  }
  iVar5 = iVar5 + iVar2;
  if ((int)uVar4 < 2) {
    if (uVar4 == 0) goto LAB_001b9251;
    bVar1 = a[iVar5];
    uVar6 = (ulong)bVar1;
    _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
    iVar3 = 1;
    iVar2 = iVar3;
    if ((char)bVar1 < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(a + iVar5,(u32 *)&iVal);
      uVar6 = _uStack_38 >> 0x20;
    }
    iVar2 = iVar2 + iVar5;
    bVar1 = a[iVar2];
    _uStack_38 = (ulong)CONCAT14(bVar1,uStack_38);
    uVar4 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      iVar3 = sqlite3Fts5GetVarint32(a + iVar2,(u32 *)&iVal);
      uVar4 = iVal;
    }
    if ((int)uVar4 < 2) goto LAB_001b922d;
    iVar7 = uVar6 << 0x20;
    iVar5 = iVar3 + iVar2;
  }
  *piOff = (ulong)(uVar4 + 0x7ffffffe & 0x7fffffff) + iVar7;
LAB_001b9251:
  *pi = iVar5;
  return 0;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal<=1 ){
      if( iVal==0 ){
        *pi = i;
        return 0;
      }
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
      if( iVal<2 ){
        /* This is a corrupt record. So stop parsing it here. */
        *piOff = -1;
        return 1;
      }
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}